

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.cpp
# Opt level: O1

void __thiscall PECommander::initCommands(PECommander *this)

{
  Command *pCVar1;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"secV","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Section by RVA","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154260;
  *(undefined4 *)&pCVar1[1]._vptr_Command = 2;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"secR","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Section by RAW","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154260;
  *(undefined4 *)&pCVar1[1]._vptr_Command = 1;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rstrings","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Print Strings from resources","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_001542b0;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rsl","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"List Resource Types","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154300;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rs","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Resource Info","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154350;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dir_mv","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Move DataDirectory","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_001543a0;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"secinfo","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Dump chosen Section info","")
  ;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_001543f0;
  *(undefined1 *)&pCVar1[1]._vptr_Command = 0;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"secfdump","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Dump chosen Section Content into a file","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_001543f0;
  *(undefined1 *)&pCVar1[1]._vptr_Command = 1;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"explist","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"List all exports","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154440;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"implist","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"List all imports","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154490;
  Commander::addCommand((Commander *)this,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PECommander::initCommands()
{
    this->addCommand("secV", new SectionByAddrCommand(Executable::RVA, "Section by RVA"));
    this->addCommand("secR", new SectionByAddrCommand(Executable::RAW, "Section by RAW"));

    this->addCommand("rstrings", new PrintStringsCommand("Print Strings from resources"));
    this->addCommand("rsl", new PrintWrapperTypesCommand("List Resource Types"));
    this->addCommand("rs", new WrapperInfoCommand("Resource Info"));

    this->addCommand("dir_mv", new MoveDataDirEntryCommand("Move DataDirectory"));
    this->addCommand("secinfo", new SectionDumpCommand("Dump chosen Section info"));
    this->addCommand("secfdump", new SectionDumpCommand("Dump chosen Section Content into a file", true));
    
    this->addCommand("explist", new ExportsListCommand("List all exports"));
    this->addCommand("implist", new ImportsListCommand("List all imports"));
}